

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constrain.cpp
# Opt level: O1

void __thiscall CaDiCaL::Internal::constrain(Internal *this,int lit)

{
  char cVar1;
  uint uVar2;
  iterator __position;
  uint *puVar3;
  pointer pcVar4;
  int *piVar5;
  uint uVar6;
  uint *puVar7;
  bool bVar8;
  int *lit_1;
  uint *puVar9;
  uint *puVar10;
  bool bVar11;
  char cVar12;
  iterator __begin4;
  int *piVar13;
  int local_24;
  
  if (lit == 0) {
    if (this->level != 0) {
      backtrack(this,0);
    }
    puVar9 = (uint *)(this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
    puVar3 = (uint *)(this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    if (puVar9 == puVar3) {
      bVar11 = false;
    }
    else {
      bVar11 = false;
      puVar7 = puVar9;
      do {
        puVar10 = puVar7 + 1;
        uVar2 = *puVar7;
        uVar6 = -uVar2;
        if (0 < (int)uVar2) {
          uVar6 = uVar2;
        }
        pcVar4 = (this->marks).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
                 .super__Vector_impl_data._M_start;
        cVar1 = pcVar4[uVar6];
        cVar12 = -cVar1;
        if (-1 < (long)(int)uVar2) {
          cVar12 = cVar1;
        }
        if (cVar12 < '\x01') {
          if (-1 < cVar12) {
            if (-1 < this->vals[(int)uVar2]) {
              if (this->vals[(int)uVar2] != '\0') goto LAB_00817dd9;
              *puVar9 = uVar2;
              puVar9 = puVar9 + 1;
              uVar2 = *puVar7;
              uVar6 = -uVar2;
              if (0 < (int)uVar2) {
                uVar6 = uVar2;
              }
              pcVar4[uVar6] = uVar2 != 0 | (byte)((int)uVar2 >> 0x1f);
            }
            goto LAB_00817d8d;
          }
LAB_00817dd9:
          bVar8 = true;
          bVar11 = true;
        }
        else {
LAB_00817d8d:
          bVar8 = false;
        }
      } while ((!bVar8) && (puVar7 = puVar10, puVar10 != puVar3));
    }
    std::vector<int,_std::allocator<int>_>::resize
              (&this->constraint,
               (long)puVar9 -
               (long)(this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2);
    puVar3 = (uint *)(this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    for (puVar9 = (uint *)(this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start; puVar9 != puVar3; puVar9 = puVar9 + 1) {
      uVar2 = *puVar9;
      uVar6 = -uVar2;
      if (0 < (int)uVar2) {
        uVar6 = uVar2;
      }
      (this->marks).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6] = '\0';
    }
    piVar13 = (this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar5 = (this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (bVar11) {
      if (piVar5 != piVar13) {
        (this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar13;
      }
    }
    else if (piVar13 == piVar5) {
      this->unsat_constraint = true;
      if (this->conflict_id == 0) {
        this->marked_failed = false;
      }
    }
    else {
      do {
        freeze(this,*piVar13);
        piVar13 = piVar13 + 1;
      } while (piVar13 != piVar5);
    }
  }
  else {
    __position._M_current =
         (this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->constraint,__position,&local_24);
    }
    else {
      *__position._M_current = lit;
      (this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  return;
}

Assistant:

void Internal::constrain (int lit) {
  if (lit)
    constraint.push_back (lit);
  else {
    if (level)
      backtrack ();
    LOG (constraint, "shrinking constraint");
    bool satisfied_constraint = false;
    const vector<int>::const_iterator end = constraint.end ();
    vector<int>::iterator i = constraint.begin ();
    for (vector<int>::const_iterator j = i; j != end; j++) {
      int tmp = marked (*j);
      if (tmp > 0) {
        LOG ("removing duplicated literal %d from constraint", *j);
      } else if (tmp < 0) {
        LOG ("tautological since both %d and %d occur in constraint", -*j,
             *j);
        satisfied_constraint = true;
        break;
      } else {
        tmp = val (*j);
        if (tmp < 0) {
          LOG ("removing falsified literal %d from constraint clause", *j);
        } else if (tmp > 0) {
          LOG ("satisfied constraint with literal %d", *j);
          satisfied_constraint = true;
          break;
        } else {
          *i++ = *j;
          mark (*j);
        }
      }
    }
    constraint.resize (i - constraint.begin ());
    for (const auto &lit : constraint)
      unmark (lit);
    if (satisfied_constraint)
      constraint.clear ();
    else if (constraint.empty ()) {
      unsat_constraint = true;
      if (!conflict_id)
        marked_failed = false; // allow to trigger failing ()
    } else
      for (const auto lit : constraint)
        freeze (lit);
  }
}